

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

char * __thiscall
btQuantizedBvh::serialize(btQuantizedBvh *this,void *dataBuffer,btSerializer *serializer)

{
  int iVar1;
  btOptimizedBvhNode *pbVar2;
  btQuantizedBvhNode *pbVar3;
  int i;
  long lVar4;
  long lVar5;
  long lVar6;
  int *piVar7;
  btOptimizedBvhNode *pbVar8;
  int i_3;
  long lVar9;
  
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x10) = (this->m_bvhAabbMax).m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4) = (this->m_bvhAabbMin).m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x20) = (this->m_bvhQuantization).m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  *(int *)((long)dataBuffer + 0x30) = this->m_curNodeIndex;
  *(uint *)((long)dataBuffer + 0x34) = (uint)this->m_useQuantization;
  iVar1 = (this->m_contiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x38) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x40) = 0;
  }
  else {
    lVar4 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_contiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x40) = lVar4;
    if (lVar4 != 0) {
      iVar1 = (this->m_contiguousNodes).m_size;
      lVar4 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x30,iVar1);
      pbVar2 = (this->m_contiguousNodes).m_data;
      if (0 < (long)iVar1) {
        lVar5 = *(long *)(lVar4 + 8);
        lVar6 = 0;
        pbVar8 = pbVar2;
        do {
          lVar9 = 4;
          do {
            *(btScalar *)(lVar5 + lVar9 * 4) = (pbVar8->m_aabbMinOrg).m_floats[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
          lVar9 = 0;
          do {
            *(btScalar *)(lVar5 + lVar9 * 4) = (pbVar8->m_aabbMinOrg).m_floats[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 4);
          *(undefined8 *)(lVar5 + 0x20) = *(undefined8 *)&pbVar2[lVar6].m_escapeIndex;
          *(int *)(lVar5 + 0x28) = pbVar2[lVar6].m_triangleIndex;
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x30;
          pbVar8 = pbVar8 + 1;
        } while (lVar6 != iVar1);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar4,"btOptimizedBvhNodeData",0x59415241);
    }
  }
  iVar1 = (this->m_quantizedContiguousNodes).m_size;
  *(int *)((long)dataBuffer + 0x3c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x48) = 0;
  }
  else {
    lVar4 = (**(code **)(*(long *)serializer + 0x38))
                      (serializer,(this->m_quantizedContiguousNodes).m_data);
    *(long *)((long)dataBuffer + 0x48) = lVar4;
    if (lVar4 != 0) {
      iVar1 = (this->m_quantizedContiguousNodes).m_size;
      lVar4 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x10,iVar1);
      pbVar3 = (this->m_quantizedContiguousNodes).m_data;
      if (0 < (long)iVar1) {
        lVar5 = *(long *)(lVar4 + 8);
        lVar6 = 0;
        do {
          *(undefined4 *)(lVar5 + 0xc + lVar6) =
               *(undefined4 *)((long)pbVar3->m_quantizedAabbMax + lVar6 + 6);
          *(undefined2 *)(lVar5 + 6 + lVar6) =
               *(undefined2 *)((long)pbVar3->m_quantizedAabbMax + lVar6);
          *(undefined2 *)(lVar5 + 8 + lVar6) =
               *(undefined2 *)((long)pbVar3->m_quantizedAabbMax + lVar6 + 2);
          *(undefined2 *)(lVar5 + 10 + lVar6) =
               *(undefined2 *)((long)pbVar3->m_quantizedAabbMax + lVar6 + 4);
          *(undefined2 *)(lVar5 + lVar6) = *(undefined2 *)((long)pbVar3->m_quantizedAabbMin + lVar6)
          ;
          *(undefined2 *)(lVar5 + 2 + lVar6) =
               *(undefined2 *)((long)pbVar3->m_quantizedAabbMin + lVar6 + 2);
          *(undefined2 *)(lVar5 + 4 + lVar6) =
               *(undefined2 *)((long)pbVar3->m_quantizedAabbMin + lVar6 + 4);
          lVar6 = lVar6 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar6);
      }
      (**(code **)(*(long *)serializer + 0x28))
                (serializer,lVar4,"btQuantizedBvhNodeData",0x59415241);
    }
  }
  *(btTraversalMode *)((long)dataBuffer + 0x58) = this->m_traversalMode;
  iVar1 = (this->m_SubtreeHeaders).m_size;
  *(int *)((long)dataBuffer + 0x5c) = iVar1;
  if (iVar1 == 0) {
    *(undefined8 *)((long)dataBuffer + 0x50) = 0;
  }
  else {
    lVar4 = (**(code **)(*(long *)serializer + 0x38))(serializer,(this->m_SubtreeHeaders).m_data);
    *(long *)((long)dataBuffer + 0x50) = lVar4;
    if (lVar4 != 0) {
      iVar1 = (this->m_SubtreeHeaders).m_size;
      lVar4 = (**(code **)(*(long *)serializer + 0x20))(serializer,0x14,iVar1);
      if (0 < (long)iVar1) {
        lVar5 = *(long *)(lVar4 + 8);
        piVar7 = &((this->m_SubtreeHeaders).m_data)->m_rootNodeIndex;
        lVar6 = 0;
        do {
          *(unsigned_short *)(lVar5 + 0xe + lVar6) = *(unsigned_short *)((long)piVar7 + -6);
          *(unsigned_short *)(lVar5 + 0x10 + lVar6) = *(unsigned_short *)(piVar7 + -1);
          *(unsigned_short *)(lVar5 + 0x12 + lVar6) = *(unsigned_short *)((long)piVar7 + -2);
          *(unsigned_short *)(lVar5 + 8 + lVar6) =
               ((btBvhSubtreeInfo *)(piVar7 + -3))->m_quantizedAabbMin[0];
          *(unsigned_short *)(lVar5 + 10 + lVar6) = *(unsigned_short *)((long)piVar7 + -10);
          *(unsigned_short *)(lVar5 + 0xc + lVar6) = *(unsigned_short *)(piVar7 + -2);
          *(undefined8 *)(lVar5 + lVar6) = *(undefined8 *)piVar7;
          piVar7 = piVar7 + 8;
          lVar6 = lVar6 + 0x14;
        } while ((long)iVar1 * 0x14 != lVar6);
      }
      (**(code **)(*(long *)serializer + 0x28))(serializer,lVar4,"btBvhSubtreeInfoData",0x59415241);
    }
  }
  return "btQuantizedBvhFloatData";
}

Assistant:

const char*	btQuantizedBvh::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btQuantizedBvhData* quantizedData = (btQuantizedBvhData*)dataBuffer;
	
	m_bvhAabbMax.serialize(quantizedData->m_bvhAabbMax);
	m_bvhAabbMin.serialize(quantizedData->m_bvhAabbMin);
	m_bvhQuantization.serialize(quantizedData->m_bvhQuantization);

	quantizedData->m_curNodeIndex = m_curNodeIndex;
	quantizedData->m_useQuantization = m_useQuantization;
	
	quantizedData->m_numContiguousLeafNodes = m_contiguousNodes.size();
	quantizedData->m_contiguousNodesPtr = (btOptimizedBvhNodeData*) (m_contiguousNodes.size() ? serializer->getUniquePointer((void*)&m_contiguousNodes[0]) : 0);
	if (quantizedData->m_contiguousNodesPtr)
	{
		int sz = sizeof(btOptimizedBvhNodeData);
		int numElem = m_contiguousNodes.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btOptimizedBvhNodeData* memPtr = (btOptimizedBvhNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			m_contiguousNodes[i].m_aabbMaxOrg.serialize(memPtr->m_aabbMaxOrg);
			m_contiguousNodes[i].m_aabbMinOrg.serialize(memPtr->m_aabbMinOrg);
			memPtr->m_escapeIndex = m_contiguousNodes[i].m_escapeIndex;
			memPtr->m_subPart = m_contiguousNodes[i].m_subPart;
			memPtr->m_triangleIndex = m_contiguousNodes[i].m_triangleIndex;
		}
		serializer->finalizeChunk(chunk,"btOptimizedBvhNodeData",BT_ARRAY_CODE,(void*)&m_contiguousNodes[0]);
	}

	quantizedData->m_numQuantizedContiguousNodes = m_quantizedContiguousNodes.size();
//	printf("quantizedData->m_numQuantizedContiguousNodes=%d\n",quantizedData->m_numQuantizedContiguousNodes);
	quantizedData->m_quantizedContiguousNodesPtr =(btQuantizedBvhNodeData*) (m_quantizedContiguousNodes.size() ? serializer->getUniquePointer((void*)&m_quantizedContiguousNodes[0]) : 0);
	if (quantizedData->m_quantizedContiguousNodesPtr)
	{
		int sz = sizeof(btQuantizedBvhNodeData);
		int numElem = m_quantizedContiguousNodes.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btQuantizedBvhNodeData* memPtr = (btQuantizedBvhNodeData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex;
			memPtr->m_quantizedAabbMax[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_quantizedContiguousNodes[i].m_quantizedAabbMin[2];
		}
		serializer->finalizeChunk(chunk,"btQuantizedBvhNodeData",BT_ARRAY_CODE,(void*)&m_quantizedContiguousNodes[0]);
	}

	quantizedData->m_traversalMode = int(m_traversalMode);
	quantizedData->m_numSubtreeHeaders = m_SubtreeHeaders.size();

	quantizedData->m_subTreeInfoPtr = (btBvhSubtreeInfoData*) (m_SubtreeHeaders.size() ? serializer->getUniquePointer((void*)&m_SubtreeHeaders[0]) : 0);
	if (quantizedData->m_subTreeInfoPtr)
	{
		int sz = sizeof(btBvhSubtreeInfoData);
		int numElem = m_SubtreeHeaders.size();
		btChunk* chunk = serializer->allocate(sz,numElem);
		btBvhSubtreeInfoData* memPtr = (btBvhSubtreeInfoData*)chunk->m_oldPtr;
		for (int i=0;i<numElem;i++,memPtr++)
		{
			memPtr->m_quantizedAabbMax[0] = m_SubtreeHeaders[i].m_quantizedAabbMax[0];
			memPtr->m_quantizedAabbMax[1] = m_SubtreeHeaders[i].m_quantizedAabbMax[1];
			memPtr->m_quantizedAabbMax[2] = m_SubtreeHeaders[i].m_quantizedAabbMax[2];
			memPtr->m_quantizedAabbMin[0] = m_SubtreeHeaders[i].m_quantizedAabbMin[0];
			memPtr->m_quantizedAabbMin[1] = m_SubtreeHeaders[i].m_quantizedAabbMin[1];
			memPtr->m_quantizedAabbMin[2] = m_SubtreeHeaders[i].m_quantizedAabbMin[2];

			memPtr->m_rootNodeIndex = m_SubtreeHeaders[i].m_rootNodeIndex;
			memPtr->m_subtreeSize = m_SubtreeHeaders[i].m_subtreeSize;
		}
		serializer->finalizeChunk(chunk,"btBvhSubtreeInfoData",BT_ARRAY_CODE,(void*)&m_SubtreeHeaders[0]);
	}
	return btQuantizedBvhDataName;
}